

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_layer.c
# Opt level: O1

void avg_pooling_layer_forward(layer_t *l)

{
  uint uVar1;
  int iVar2;
  data_val_t *pdVar3;
  data_val_t *pdVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long local_60;
  
  if (0 < l->n->batch) {
    uVar1 = *(uint *)&l[1].func;
    uVar8 = *(int *)&l[1].in.grad * *(int *)((long)&l[1].in.grad + 4);
    iVar2 = *(int *)&l[1].in.m;
    iVar14 = iVar2 * iVar2;
    iVar13 = 0;
    do {
      im2col(&(l->in).val,(l->in).size * iVar13,*(int *)&l[1].func,*(int *)&l[1].in.val,
             *(int *)((long)&l[1].func + 4),*(int *)&l[1].in.m,*(int *)((long)&l[1].in.m + 4),
             *(int *)&l[1].in.v,&(l->extra).val,0);
      if (0 < (int)uVar1) {
        iVar5 = 0;
        local_60 = 0;
        uVar7 = 0;
        do {
          if (iVar2 != 0) {
            uVar11 = 0;
            lVar9 = local_60;
            do {
              if (0 < (int)uVar8) {
                pdVar3 = (l->out).val;
                pdVar4 = (l->extra).val;
                iVar10 = (l->out).size;
                uVar12 = 0;
                do {
                  iVar6 = iVar10 * iVar13 + iVar5 + (int)uVar12;
                  pdVar3[iVar6] = *(float *)((long)pdVar4 + uVar12 * 4 + lVar9) + pdVar3[iVar6];
                  uVar12 = uVar12 + 1;
                } while (uVar8 != uVar12);
              }
              uVar11 = uVar11 + 1;
              lVar9 = lVar9 + (long)(int)uVar8 * 4;
            } while (uVar11 != iVar14 + (uint)(iVar14 == 0));
          }
          if (0 < (int)uVar8) {
            pdVar3 = (l->out).val;
            iVar10 = (l->out).size * iVar13 + iVar5;
            uVar11 = (ulong)uVar8;
            do {
              pdVar3[iVar10] = pdVar3[iVar10] / (float)iVar14;
              iVar10 = iVar10 + 1;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          uVar7 = uVar7 + 1;
          local_60 = local_60 + (long)iVar14 * (long)(int)uVar8 * 4;
          iVar5 = iVar5 + uVar8;
        } while (uVar7 != uVar1);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < l->n->batch);
  }
  return;
}

Assistant:

static void avg_pooling_layer_forward(layer_t *l)
{
	int i = 0, j = 0, k = 0, b = 0;
	pooling_layer_t *pooling = (pooling_layer_t *)l;

	int channels = pooling->ic;
	int pool_size = pooling->k * pooling->k;
	int out_size = pooling->oh * pooling->ow;

	for (b = 0; b < l->n->batch; ++b)
	{
		im2col(&l->in.val, b * l->in.size, pooling->ic, pooling->ih, pooling->iw, pooling->k, pooling->s, pooling->p, &l->extra.val, 0);

		for (k = 0; k < channels; ++k)
		{
			int offset = k * out_size;
			int pool_offset = pool_size * offset;

			for (i = 0; i < pool_size; ++i)
			{
				int index = pool_offset + i * out_size;
				for (j = 0; j < out_size; ++j)
				{
					l->out.val[b * l->out.size + offset + j] += l->extra.val[index + j];
				}
			}

			for (j = 0; j < out_size; ++j)
			{
				l->out.val[b * l->out.size + offset + j] /= pool_size;
			}
		}
	}
}